

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O2

SampleInfo * __thiscall
Transformed::sampleSurface(SampleInfo *__return_storage_ptr__,Transformed *this,Sampler *sampler)

{
  mat4f *mat;
  vec3f vVar1;
  vec3f vVar2;
  vec3f vVar3;
  vec4f vVar4;
  SampleInfo info;
  vec3f local_ec;
  vec3f local_e0;
  float local_d4;
  vec3f local_d0;
  vec3f local_c0;
  vec4f local_b0;
  vec4f local_a0;
  vec4f local_90;
  vec4f local_80;
  mat4f local_70;
  
  (*this->inner->_vptr_Primitive[2])(&local_ec);
  local_a0.x = 0.0;
  local_a0.y = 0.0;
  local_a0.z = 0.0;
  local_b0.x = 0.0;
  local_b0.y = 0.0;
  local_b0.z = 0.0;
  getLocalBasis(&local_e0,(vec3f *)&local_a0,(vec3f *)&local_b0);
  mat = &this->trans;
  vVar1 = transformedPoint(mat,&local_ec);
  transposed(&local_70,&this->invTrans);
  vVar2 = transformedDir(&local_70,&local_e0);
  local_80.x = local_a0.x;
  local_80.y = local_a0.y;
  local_80.z = local_a0.z;
  local_80.w = 0.0;
  vVar4 = operator*(mat,&local_80);
  local_c0._0_8_ = vVar4._0_8_;
  local_c0.z = vVar4.z;
  local_90.x = local_b0.x;
  local_90.y = local_b0.y;
  local_90.z = local_b0.z;
  local_90.w = 0.0;
  vVar4 = operator*(mat,&local_90);
  local_d0._0_8_ = vVar4._0_8_;
  local_d0.z = vVar4.z;
  vVar3 = cross(&local_c0,&local_d0);
  (__return_storage_ptr__->p).x = (float)(int)vVar1._0_8_;
  (__return_storage_ptr__->p).y = (float)(int)((ulong)vVar1._0_8_ >> 0x20);
  (__return_storage_ptr__->p).z = vVar1.z;
  (__return_storage_ptr__->normal).x = (float)(int)vVar2._0_8_;
  (__return_storage_ptr__->normal).y = (float)(int)((ulong)vVar2._0_8_ >> 0x20);
  (__return_storage_ptr__->normal).z = vVar2.z;
  __return_storage_ptr__->pdf =
       local_d4 / ABS(SQRT(vVar3.z * vVar3.z + vVar3.x * vVar3.x + vVar3.y * vVar3.y));
  return __return_storage_ptr__;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const
	{
		SampleInfo info = inner->sampleSurface(sampler);
		vec3f N1,N2;
		getLocalBasis(info.normal, N1, N2);
		return SampleInfo(transformedPoint(trans, info.p),
			transformedDir(transposed(invTrans), info.normal),
			info.pdf / fabs(norm(cross((trans*vec4f(N1,0)).xyz(), (trans*vec4f(N2,0)).xyz()))));
	}